

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCreateSourceAndEventIf.cpp
# Opt level: O2

int anon_unknown.dwarf_1c9cca::failIfCalled(void)

{
  code *pcVar1;
  char extraout_AL;
  int iVar2;
  int extraout_EAX;
  double __x;
  MessageBuilder _DOCTEST_MESSAGE_2;
  
  doctest::detail::MessageBuilder::MessageBuilder
            (&_DOCTEST_MESSAGE_2,
             "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/unit/binlog/TestCreateSourceAndEventIf.cpp"
             ,0x1c,is_require);
  std::operator<<(_DOCTEST_MESSAGE_2.m_stream,"Argument of disabled severity evaluated");
  doctest::detail::MessageBuilder::log(&_DOCTEST_MESSAGE_2,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    iVar2 = (*pcVar1)();
    return iVar2;
  }
  doctest::detail::MessageBuilder::react(&_DOCTEST_MESSAGE_2);
  doctest::detail::MessageBuilder::~MessageBuilder(&_DOCTEST_MESSAGE_2);
  return extraout_EAX;
}

Assistant:

int failIfCalled()
{
  FAIL("Argument of disabled severity evaluated");
  return 0;
}